

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O3

void __thiscall
cppcms::session_pool::gc_job::gc_job(gc_job *this,service *ser,double freq,session_pool *pool)

{
  deadline_timer *this_00;
  io_service *piVar1;
  
  (this->super_enable_shared_from_this<cppcms::session_pool::gc_job>)._M_weak_this.
  super___weak_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::session_pool::gc_job>)._M_weak_this.
  super___weak_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (deadline_timer *)operator_new(0x28);
  piVar1 = service::get_io_service(ser);
  booster::aio::deadline_timer::deadline_timer(this_00,piVar1);
  (this->timer_).super___shared_ptr<booster::aio::deadline_timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::aio::deadline_timer*>
            (&(this->timer_).
              super___shared_ptr<booster::aio::deadline_timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  this->service_ = ser;
  this->freq_ = freq;
  this->pool_ = pool;
  return;
}

Assistant:

gc_job(service *ser,double freq,session_pool *pool) :
		timer_(new booster::aio::deadline_timer(ser->get_io_service())),
		service_(ser),
		freq_(freq),
		pool_(pool)
	{
	}